

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

AggregateFunctionSet * duckdb::ReservoirQuantileFun::GetFunctions(void)

{
  AggregateFunctionSet *in_RDI;
  LogicalType *in_stack_00000170;
  vector<duckdb::LogicalType,_true> *in_stack_00000178;
  AggregateFunctionSet *in_stack_00000180;
  AggregateFunctionSet *reservoir_quantile;
  LogicalType *in_stack_000004b8;
  AggregateFunctionSet *in_stack_000004c0;
  allocator_type *in_stack_fffffffffffffd68;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffd70;
  initializer_list<duckdb::LogicalType> in_stack_fffffffffffffd78;
  LogicalType *local_238;
  LogicalType *local_210;
  LogicalType local_1f0 [24];
  LogicalType local_1d8 [24];
  LogicalType local_1c0 [24];
  LogicalType local_1a8 [24];
  LogicalType local_190 [24];
  LogicalType local_178 [24];
  LogicalType local_160 [24];
  LogicalType local_148 [24];
  LogicalType local_130 [31];
  undefined1 local_111;
  LogicalType local_110 [24];
  LogicalType *local_f8;
  LogicalType local_f0 [24];
  LogicalType local_d8 [24];
  LogicalType *local_c0;
  undefined8 local_b8;
  LogicalType local_98 [40];
  LogicalType *local_70;
  LogicalType local_68 [24];
  LogicalType local_50 [24];
  LogicalType *local_38;
  undefined8 local_30;
  undefined1 local_9;
  
  local_9 = 0;
  duckdb::AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  local_70 = local_68;
  duckdb::LogicalType::LogicalType(local_70,DECIMAL);
  local_70 = local_50;
  duckdb::LogicalType::LogicalType(local_70,DOUBLE);
  local_38 = local_68;
  local_30 = 2;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x9b4568);
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd78,in_stack_fffffffffffffd68);
  duckdb::LogicalType::LogicalType(local_98,DECIMAL);
  GetReservoirQuantileDecimalFunction(in_stack_00000180,in_stack_00000178,in_stack_00000170);
  duckdb::LogicalType::~LogicalType(local_98);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x9b45dc);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x9b45e9);
  local_210 = (LogicalType *)&local_38;
  do {
    local_210 = local_210 + -0x18;
    duckdb::LogicalType::~LogicalType(local_210);
  } while (local_210 != local_68);
  local_111 = 1;
  local_f8 = local_f0;
  duckdb::LogicalType::LogicalType(local_f8,DECIMAL);
  local_f8 = local_d8;
  duckdb::LogicalType::LogicalType(local_110,DOUBLE);
  duckdb::LogicalType::LIST(local_d8);
  local_111 = 0;
  local_c0 = local_f0;
  local_b8 = 2;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x9b46cc);
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd78,in_stack_fffffffffffffd68);
  duckdb::LogicalType::LogicalType(local_148,DECIMAL);
  duckdb::LogicalType::LIST(local_130);
  GetReservoirQuantileDecimalFunction(in_stack_00000180,in_stack_00000178,in_stack_00000170);
  duckdb::LogicalType::~LogicalType(local_130);
  duckdb::LogicalType::~LogicalType(local_148);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x9b4761);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x9b476e);
  local_238 = (LogicalType *)&local_c0;
  do {
    local_238 = local_238 + -0x18;
    duckdb::LogicalType::~LogicalType(local_238);
  } while (local_238 != local_f0);
  duckdb::LogicalType::~LogicalType(local_110);
  duckdb::LogicalType::LogicalType(local_160,TINYINT);
  DefineReservoirQuantile(in_stack_000004c0,in_stack_000004b8);
  duckdb::LogicalType::~LogicalType(local_160);
  duckdb::LogicalType::LogicalType(local_178,SMALLINT);
  DefineReservoirQuantile(in_stack_000004c0,in_stack_000004b8);
  duckdb::LogicalType::~LogicalType(local_178);
  duckdb::LogicalType::LogicalType(local_190,INTEGER);
  DefineReservoirQuantile(in_stack_000004c0,in_stack_000004b8);
  duckdb::LogicalType::~LogicalType(local_190);
  duckdb::LogicalType::LogicalType(local_1a8,BIGINT);
  DefineReservoirQuantile(in_stack_000004c0,in_stack_000004b8);
  duckdb::LogicalType::~LogicalType(local_1a8);
  duckdb::LogicalType::LogicalType(local_1c0,HUGEINT);
  DefineReservoirQuantile(in_stack_000004c0,in_stack_000004b8);
  duckdb::LogicalType::~LogicalType(local_1c0);
  duckdb::LogicalType::LogicalType(local_1d8,FLOAT);
  DefineReservoirQuantile(in_stack_000004c0,in_stack_000004b8);
  duckdb::LogicalType::~LogicalType(local_1d8);
  duckdb::LogicalType::LogicalType(local_1f0,DOUBLE);
  DefineReservoirQuantile(in_stack_000004c0,in_stack_000004b8);
  duckdb::LogicalType::~LogicalType(local_1f0);
  return in_RDI;
}

Assistant:

AggregateFunctionSet ReservoirQuantileFun::GetFunctions() {
	AggregateFunctionSet reservoir_quantile;

	// DECIMAL
	GetReservoirQuantileDecimalFunction(reservoir_quantile, {LogicalTypeId::DECIMAL, LogicalType::DOUBLE},
	                                    LogicalTypeId::DECIMAL);
	GetReservoirQuantileDecimalFunction(reservoir_quantile,
	                                    {LogicalTypeId::DECIMAL, LogicalType::LIST(LogicalType::DOUBLE)},
	                                    LogicalType::LIST(LogicalTypeId::DECIMAL));

	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::TINYINT);
	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::SMALLINT);
	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::INTEGER);
	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::BIGINT);
	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::HUGEINT);
	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::FLOAT);
	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::DOUBLE);
	return reservoir_quantile;
}